

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.h
# Opt level: O0

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::Descriptor>
                   (Descriptor *descriptor,FileDescriptor *file,bool preSpace,bool postNewline)

{
  string *__rhs;
  byte in_CL;
  FileDescriptor *in_RDX;
  Descriptor *in_RSI;
  string *in_RDI;
  byte in_R8B;
  FileDescriptor *sourceFile;
  string message;
  bool isFileLevelDeprecation;
  bool isDeprecated;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  allocator *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_fffffffffffffec0;
  string *__lhs_00;
  allocator local_122;
  undefined1 local_121 [33];
  string local_100 [39];
  undefined1 local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [48];
  string local_68 [32];
  FileDescriptor *local_48;
  string local_40 [36];
  bool local_1c;
  bool local_1b;
  byte local_1a;
  byte local_19;
  FileDescriptor *local_18;
  Descriptor *local_10;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  __lhs_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Descriptor::options(in_RSI);
  local_1b = MessageOptions::deprecated((MessageOptions *)0x55bb57);
  local_1c = false;
  if ((!local_1b) && (local_18 != (FileDescriptor *)0x0)) {
    FileDescriptor::options(local_18);
    local_1c = FileOptions::deprecated((FileOptions *)0x55bb92);
    local_1b = local_1c;
  }
  if (local_1b == false) {
    paVar1 = &local_122;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__lhs_00,"",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_122);
  }
  else {
    std::__cxx11::string::string(local_40);
    local_48 = Descriptor::file(local_10);
    if ((local_1c & 1U) == 0) {
      Descriptor::full_name_abi_cxx11_(local_10);
      std::operator+(__lhs_00,in_stack_fffffffffffffec0);
      FileDescriptor::name_abi_cxx11_(local_48);
      std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
      std::__cxx11::string::operator=(local_40,local_98);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_d8);
    }
    else {
      __rhs = FileDescriptor::name_abi_cxx11_(local_48);
      std::operator+(__lhs_00,(char *)__rhs);
      std::__cxx11::string::operator=(local_40,local_68);
      std::__cxx11::string::~string(local_68);
    }
    local_d9 = 0;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_121 + 1),"GPB_DEPRECATED_MSG(\"",(allocator *)__lhs);
    std::operator+(__lhs,in_stack_fffffffffffffea0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string((string *)(local_121 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_121);
    if ((local_19 & 1) != 0) {
      std::__cxx11::string::insert((ulong)__lhs_00,(char *)0x0);
    }
    if ((local_1a & 1) != 0) {
      std::__cxx11::string::append((char *)__lhs_00);
    }
    local_d9 = 1;
    std::__cxx11::string::~string(local_40);
  }
  return in_RDI;
}

Assistant:

string GetOptionalDeprecatedAttribute(
    const TDescriptor* descriptor,
    const FileDescriptor* file = NULL,
    bool preSpace = true, bool postNewline = false) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  bool isFileLevelDeprecation = false;
  if (!isDeprecated && file) {
    isFileLevelDeprecation = file->options().deprecated();
    isDeprecated = isFileLevelDeprecation;
  }
  if (isDeprecated) {
    string message;
    const FileDescriptor* sourceFile = descriptor->file();
    if (isFileLevelDeprecation) {
      message = sourceFile->name() + " is deprecated.";
    } else {
      message = descriptor->full_name() + " is deprecated (see " +
                sourceFile->name() + ").";
    }

    string result = string("GPB_DEPRECATED_MSG(\"") + message + "\")";
    if (preSpace) {
      result.insert(0, " ");
    }
    if (postNewline) {
      result.append("\n");
    }
    return result;
  } else {
    return "";
  }
}